

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.cpp
# Opt level: O3

bool __thiscall
helics::TimeDependencies::checkIfReadyForTimeGrant
          (TimeDependencies *this,bool iterating,Time desiredGrantTime,GrantDelayMode delayMode)

{
  TimeState TVar1;
  pointer pDVar2;
  bool bVar3;
  long lVar4;
  undefined7 in_register_00000031;
  __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  __it;
  __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  __it_00;
  __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  __it_01;
  __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  __it_02;
  pointer pDVar5;
  long lVar6;
  pointer pDVar7;
  pointer pDVar8;
  
  if ((int)CONCAT71(in_register_00000031,iterating) == 0) {
    if (delayMode == WAITING) {
      pDVar7 = (this->dependencies).
               super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
               _M_impl.super__Vector_impl_data._M_start;
      while( true ) {
        if (pDVar7 == (this->dependencies).
                      super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
          return true;
        }
        if ((pDVar7->dependency == true) &&
           (lVar4 = (pDVar7->super_TimeData).next.internalTimeCode,
           (pDVar7->connection != SELF && lVar4 != 0x7fffffffffffffff) &&
           lVar4 <= desiredGrantTime.internalTimeCode)) break;
        pDVar7 = pDVar7 + 1;
      }
      return false;
    }
    if (delayMode != INTERRUPTED) {
      if (delayMode != NONE) {
        return true;
      }
      pDVar7 = (this->dependencies).
               super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
               _M_impl.super__Vector_impl_data._M_start;
      do {
        if (pDVar7 == (this->dependencies).
                      super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
          return true;
        }
        if (((pDVar7->dependency == true) &&
            (lVar4 = (pDVar7->super_TimeData).next.internalTimeCode, lVar4 != 0x7fffffffffffffff))
           && (pDVar7->connection != SELF)) {
          if (lVar4 < desiredGrantTime.internalTimeCode) {
            return false;
          }
          if (lVar4 == desiredGrantTime.internalTimeCode) {
            TVar1 = (pDVar7->super_TimeData).mTimeState;
            if (TVar1 == time_requested) {
              if (pDVar7->nonGranting != false) {
                return false;
              }
            }
            else if (TVar1 == time_granted) {
              return false;
            }
          }
        }
        pDVar7 = pDVar7 + 1;
      } while( true );
    }
    pDVar7 = (this->dependencies).
             super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      if (pDVar7 == (this->dependencies).
                    super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        return true;
      }
      if (((pDVar7->dependency == true) &&
          (lVar4 = (pDVar7->super_TimeData).next.internalTimeCode, lVar4 != 0x7fffffffffffffff)) &&
         (pDVar7->connection != SELF)) {
        if (lVar4 < desiredGrantTime.internalTimeCode) {
          return false;
        }
        if (lVar4 == desiredGrantTime.internalTimeCode) {
          TVar1 = (pDVar7->super_TimeData).mTimeState;
          if (TVar1 == time_requested) {
            if (pDVar7->nonGranting != false) {
              return false;
            }
          }
          else if (TVar1 == time_granted) {
            return false;
          }
          if (((pDVar7->super_TimeData).interrupted == false) &&
             ((pDVar7->super_TimeData).delayedTiming != true)) {
            return false;
          }
        }
      }
      pDVar7 = pDVar7 + 1;
    } while( true );
  }
  pDVar7 = (this->dependencies).
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pDVar2 = (this->dependencies).
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)pDVar2 - (long)pDVar7;
  lVar6 = (lVar4 >> 3) * 0x2e8ba2e8ba2e8ba3 >> 2;
  pDVar8 = pDVar7;
  if (0 < lVar6) {
    pDVar8 = pDVar7 + lVar6 * 4;
    lVar6 = lVar6 + 1;
    __it_02._M_current._1_7_ = 0;
    __it_02._M_current._0_1_ = delayMode;
    do {
      bVar3 = __gnu_cxx::__ops::
              _Iter_negate<helics::TimeDependencies::checkIfReadyForTimeGrant(bool,TimeRepresentation<count_time<9,long>>,helics::GrantDelayMode)const::$_0>
              ::operator()((_Iter_negate<helics::TimeDependencies::checkIfReadyForTimeGrant(bool,TimeRepresentation<count_time<9,long>>,helics::GrantDelayMode)const::__0>
                            *)desiredGrantTime.internalTimeCode,__it_02);
      pDVar5 = pDVar7;
      if (bVar3) goto LAB_003031a8;
      bVar3 = __gnu_cxx::__ops::
              _Iter_negate<helics::TimeDependencies::checkIfReadyForTimeGrant(bool,TimeRepresentation<count_time<9,long>>,helics::GrantDelayMode)const::$_0>
              ::operator()((_Iter_negate<helics::TimeDependencies::checkIfReadyForTimeGrant(bool,TimeRepresentation<count_time<9,long>>,helics::GrantDelayMode)const::__0>
                            *)desiredGrantTime.internalTimeCode,__it_02);
      pDVar5 = pDVar7 + 1;
      if (bVar3) goto LAB_003031a8;
      bVar3 = __gnu_cxx::__ops::
              _Iter_negate<helics::TimeDependencies::checkIfReadyForTimeGrant(bool,TimeRepresentation<count_time<9,long>>,helics::GrantDelayMode)const::$_0>
              ::operator()((_Iter_negate<helics::TimeDependencies::checkIfReadyForTimeGrant(bool,TimeRepresentation<count_time<9,long>>,helics::GrantDelayMode)const::__0>
                            *)desiredGrantTime.internalTimeCode,__it_02);
      pDVar5 = pDVar7 + 2;
      if (bVar3) goto LAB_003031a8;
      bVar3 = __gnu_cxx::__ops::
              _Iter_negate<helics::TimeDependencies::checkIfReadyForTimeGrant(bool,TimeRepresentation<count_time<9,long>>,helics::GrantDelayMode)const::$_0>
              ::operator()((_Iter_negate<helics::TimeDependencies::checkIfReadyForTimeGrant(bool,TimeRepresentation<count_time<9,long>>,helics::GrantDelayMode)const::__0>
                            *)desiredGrantTime.internalTimeCode,__it_02);
      pDVar5 = pDVar7 + 3;
      if (bVar3) goto LAB_003031a8;
      pDVar7 = pDVar7 + 4;
      lVar6 = lVar6 + -1;
    } while (1 < lVar6);
    lVar4 = (long)pDVar2 - (long)pDVar8;
  }
  lVar4 = (lVar4 >> 3) * 0x2e8ba2e8ba2e8ba3;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      pDVar5 = pDVar2;
      if ((lVar4 != 3) ||
         (__it._M_current._1_7_ = 0, __it._M_current._0_1_ = delayMode,
         bVar3 = __gnu_cxx::__ops::
                 _Iter_negate<helics::TimeDependencies::checkIfReadyForTimeGrant(bool,TimeRepresentation<count_time<9,long>>,helics::GrantDelayMode)const::$_0>
                 ::operator()((_Iter_negate<helics::TimeDependencies::checkIfReadyForTimeGrant(bool,TimeRepresentation<count_time<9,long>>,helics::GrantDelayMode)const::__0>
                               *)desiredGrantTime.internalTimeCode,__it), pDVar5 = pDVar8, bVar3))
      goto LAB_003031a8;
      pDVar8 = pDVar8 + 1;
    }
    __it_00._M_current._1_7_ = 0;
    __it_00._M_current._0_1_ = delayMode;
    bVar3 = __gnu_cxx::__ops::
            _Iter_negate<helics::TimeDependencies::checkIfReadyForTimeGrant(bool,TimeRepresentation<count_time<9,long>>,helics::GrantDelayMode)const::$_0>
            ::operator()((_Iter_negate<helics::TimeDependencies::checkIfReadyForTimeGrant(bool,TimeRepresentation<count_time<9,long>>,helics::GrantDelayMode)const::__0>
                          *)desiredGrantTime.internalTimeCode,__it_00);
    pDVar5 = pDVar8;
    if (bVar3) goto LAB_003031a8;
    pDVar8 = pDVar8 + 1;
  }
  __it_01._M_current._1_7_ = 0;
  __it_01._M_current._0_1_ = delayMode;
  bVar3 = __gnu_cxx::__ops::
          _Iter_negate<helics::TimeDependencies::checkIfReadyForTimeGrant(bool,TimeRepresentation<count_time<9,long>>,helics::GrantDelayMode)const::$_0>
          ::operator()((_Iter_negate<helics::TimeDependencies::checkIfReadyForTimeGrant(bool,TimeRepresentation<count_time<9,long>>,helics::GrantDelayMode)const::__0>
                        *)desiredGrantTime.internalTimeCode,__it_01);
  pDVar5 = pDVar8;
  if (!bVar3) {
    pDVar5 = pDVar2;
  }
LAB_003031a8:
  return pDVar5 == pDVar2;
}

Assistant:

bool TimeDependencies::checkIfReadyForTimeGrant(bool iterating,
                                                Time desiredGrantTime,
                                                GrantDelayMode delayMode) const
{
    if (iterating) {
        return std::all_of(dependencies.begin(),
                           dependencies.end(),
                           [desiredGrantTime, delayMode](const auto& dep) {
                               return iteratingTimeGrantCheck(dep, desiredGrantTime, delayMode);
                           });
    }
    switch (delayMode) {
        case GrantDelayMode::NONE:
            for (const auto& dep : dependencies) {
                if (!dep.dependency || dep.next >= cBigTime) {
                    continue;
                }
                if (dep.connection == ConnectionType::SELF) {
                    continue;
                }
                if (dep.next < desiredGrantTime) {
                    return false;
                }
                if (dep.next == desiredGrantTime) {
                    if (dep.mTimeState == TimeState::time_granted) {
                        return false;
                    }
                    if (dep.mTimeState == TimeState::time_requested && dep.nonGranting) {
                        return false;
                    }
                }
            }
            break;
        case GrantDelayMode::INTERRUPTED:
            for (const auto& dep : dependencies) {
                if (!dep.dependency || dep.next >= cBigTime) {
                    continue;
                }
                if (dep.connection == ConnectionType::SELF) {
                    continue;
                }
                if (dep.next < desiredGrantTime) {
                    return false;
                }
                if (dep.next == desiredGrantTime) {
                    if (dep.mTimeState == TimeState::time_granted) {
                        return false;
                    }
                    if (dep.mTimeState == TimeState::time_requested && dep.nonGranting) {
                        return false;
                    }

                    if (dep.interrupted || dep.delayedTiming) {
                        continue;
                    }
                    return false;
                }
            }
            break;
        case GrantDelayMode::WAITING:
            for (const auto& dep : dependencies) {
                if (!dep.dependency || dep.next >= cBigTime) {
                    continue;
                }
                if (dep.connection == ConnectionType::SELF) {
                    continue;
                }
                if (dep.next <= desiredGrantTime) {
                    return false;
                }
            }
            break;
    }

    return true;
}